

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realdata_unit.c
# Opt level: O0

_Bool is_intersect_correct(roaring_bitmap_t *bitmap1,roaring_bitmap_t *bitmap2)

{
  _Bool _Var1;
  uint64_t uVar2;
  roaring_bitmap_t *bitmap1plus2;
  roaring_bitmap_t *in_stack_00000008;
  _Bool answer;
  roaring_bitmap_t *bitmap1minus2;
  uint64_t c;
  roaring_bitmap_t *in_stack_00000060;
  roaring_bitmap_t *in_stack_00000068;
  bool local_29;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar2 = roaring_bitmap_and_cardinality
                    (bitmap1plus2,
                     (roaring_bitmap_t *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  _Var1 = roaring_bitmap_intersect(in_stack_00000008,bitmap1plus2);
  if (_Var1 == (uVar2 != 0)) {
    roaring_bitmap_andnot(in_stack_00000068,in_stack_00000060);
    local_29 = roaring_bitmap_intersect(in_stack_00000008,bitmap1plus2);
    local_29 = !local_29;
    roaring_bitmap_or(in_stack_00000068,in_stack_00000060);
    _Var1 = roaring_bitmap_intersect(in_stack_00000008,bitmap1plus2);
    if (!_Var1) {
      local_29 = false;
    }
    roaring_bitmap_free((roaring_bitmap_t *)0x102ff7);
    roaring_bitmap_free((roaring_bitmap_t *)0x103000);
  }
  else {
    local_29 = false;
  }
  return local_29;
}

Assistant:

bool is_intersect_correct(roaring_bitmap_t *bitmap1,
                          roaring_bitmap_t *bitmap2) {
    uint64_t c = roaring_bitmap_and_cardinality(bitmap1, bitmap2);
    if (roaring_bitmap_intersect(bitmap1, bitmap2) != (c > 0)) return false;
    roaring_bitmap_t *bitmap1minus2 = roaring_bitmap_andnot(bitmap1, bitmap2);
    bool answer = true;
    if (roaring_bitmap_intersect(bitmap1minus2, bitmap2)) {
        answer = false;
    }
    roaring_bitmap_t *bitmap1plus2 = roaring_bitmap_or(bitmap1, bitmap2);
    if (!roaring_bitmap_intersect(bitmap1plus2, bitmap2)) {
        answer = false;
    }
    roaring_bitmap_free(bitmap1minus2);
    roaring_bitmap_free(bitmap1plus2);
    return answer;
}